

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

void ProcessRows(VP8LDecoder *dec,int row)

{
  WEBP_CSP_MODE out_colorspace;
  VP8Io *pVVar1;
  WebPDecBuffer *pWVar2;
  WebPRescaler *pWVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int y_pos;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint8_t *rgba;
  long lVar12;
  uint32_t *puVar13;
  uint32_t *local_48;
  uint8_t *local_38;
  
  iVar5 = dec->last_row;
  if (row - iVar5 != 0 && iVar5 <= row) {
    pVVar1 = dec->io;
    local_48 = dec->argb_cache;
    iVar9 = pVVar1->width;
    ApplyInverseTransforms(dec,iVar5,row - iVar5,dec->pixels + (long)dec->width * (long)iVar5);
    iVar5 = dec->last_row;
    iVar10 = pVVar1->crop_top;
    iVar6 = pVVar1->crop_bottom;
    if (row <= pVVar1->crop_bottom) {
      iVar6 = row;
    }
    iVar4 = iVar5;
    if (iVar10 - iVar5 != 0 && iVar5 <= iVar10) {
      iVar4 = iVar10;
    }
    uVar8 = iVar6 - iVar4;
    if (uVar8 != 0 && iVar4 <= iVar6) {
      iVar9 = iVar9 * 4;
      iVar6 = 0;
      if (iVar5 < iVar10) {
        iVar6 = (iVar10 - iVar5) * iVar9;
      }
      local_48 = (uint32_t *)((long)local_48 + (long)pVVar1->crop_left * 4 + (long)iVar6);
      pVVar1->mb_y = iVar4 - iVar10;
      iVar5 = pVVar1->crop_right - pVVar1->crop_left;
      pVVar1->mb_w = iVar5;
      pVVar1->mb_h = uVar8;
      pWVar2 = dec->output;
      out_colorspace = pWVar2->colorspace;
      if (out_colorspace < MODE_YUV) {
        lVar12 = (long)(pWVar2->u).RGBA.stride;
        local_38 = (pWVar2->u).RGBA.rgba + dec->last_out_row * lVar12;
        uVar7 = uVar8;
        if (pVVar1->use_scaling == 0) {
          for (; uVar11 = uVar8, 0 < (int)uVar7; uVar7 = uVar7 - 1) {
            VP8LConvertFromBGRA(local_48,iVar5,out_colorspace,local_38);
            local_48 = (uint32_t *)((long)local_48 + (long)iVar9);
            local_38 = local_38 + lVar12;
          }
        }
        else {
          uVar11 = 0;
          iVar5 = 0;
          while (iVar10 = uVar8 - iVar5, iVar10 != 0 && iVar5 <= (int)uVar8) {
            puVar13 = (uint32_t *)((long)iVar5 * (long)iVar9 + (long)local_48);
            rgba = local_38 + (ulong)uVar11 * lVar12;
            iVar6 = WebPRescaleNeededLines(dec->rescaler,iVar10);
            WebPMultARGBRows((uint8_t *)puVar13,iVar9,dec->rescaler->src_width,iVar6,0);
            iVar10 = WebPRescalerImport(dec->rescaler,iVar10,(uint8_t *)puVar13,iVar9);
            iVar5 = iVar5 + iVar10;
            pWVar3 = dec->rescaler;
            puVar13 = (uint32_t *)pWVar3->dst;
            iVar10 = pWVar3->dst_width;
            while ((pWVar3->dst_y < pWVar3->dst_height && (pWVar3->y_accum < 1))) {
              WebPRescalerExportRow(pWVar3);
              (*WebPMultARGBRow)(puVar13,iVar10,1);
              VP8LConvertFromBGRA(puVar13,iVar10,out_colorspace,rgba);
              rgba = rgba + lVar12;
              uVar11 = uVar11 + 1;
            }
          }
        }
        dec->last_out_row = dec->last_out_row + uVar11;
      }
      else {
        iVar10 = dec->last_out_row;
        if (pVVar1->use_scaling == 0) {
          for (; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
            ConvertToYUVA(local_48,iVar5,iVar10,dec->output);
            local_48 = (uint32_t *)((long)local_48 + (long)iVar9);
            iVar10 = iVar10 + 1;
          }
        }
        else {
          iVar5 = 0;
          while (iVar6 = uVar8 - iVar5, iVar6 != 0 && iVar5 <= (int)uVar8) {
            iVar4 = WebPRescaleNeededLines(dec->rescaler,iVar6);
            WebPMultARGBRows((uint8_t *)local_48,iVar9,dec->rescaler->src_width,iVar4,0);
            iVar6 = WebPRescalerImport(dec->rescaler,iVar6,(uint8_t *)local_48,iVar9);
            iVar5 = iVar5 + iVar6;
            local_48 = (uint32_t *)((long)local_48 + (long)(iVar4 * iVar9));
            pWVar3 = dec->rescaler;
            puVar13 = (uint32_t *)pWVar3->dst;
            iVar6 = pWVar3->dst_width;
            while ((pWVar3->dst_y < pWVar3->dst_height && (pWVar3->y_accum < 1))) {
              WebPRescalerExportRow(pWVar3);
              (*WebPMultARGBRow)(puVar13,iVar6,1);
              ConvertToYUVA(puVar13,iVar6,iVar10,dec->output);
              iVar10 = iVar10 + 1;
            }
          }
        }
        dec->last_out_row = iVar10;
      }
    }
  }
  dec->last_row = row;
  return;
}

Assistant:

static void ProcessRows(VP8LDecoder* const dec, int row) {
  const uint32_t* const rows = dec->pixels + dec->width * dec->last_row;
  const int num_rows = row - dec->last_row;

  assert(row <= dec->io->crop_bottom);
  // We can't process more than NUM_ARGB_CACHE_ROWS at a time (that's the size
  // of argb_cache), but we currently don't need more than that.
  assert(num_rows <= NUM_ARGB_CACHE_ROWS);
  if (num_rows > 0) {    // Emit output.
    VP8Io* const io = dec->io;
    uint8_t* rows_data = (uint8_t*)dec->argb_cache;
    const int in_stride = io->width * sizeof(uint32_t);  // in unit of RGBA
    ApplyInverseTransforms(dec, dec->last_row, num_rows, rows);
    if (!SetCropWindow(io, dec->last_row, row, &rows_data, in_stride)) {
      // Nothing to output (this time).
    } else {
      const WebPDecBuffer* const output = dec->output;
      if (WebPIsRGBMode(output->colorspace)) {  // convert to RGBA
        const WebPRGBABuffer* const buf = &output->u.RGBA;
        uint8_t* const rgba =
            buf->rgba + (ptrdiff_t)dec->last_out_row * buf->stride;
        const int num_rows_out =
#if !defined(WEBP_REDUCE_SIZE)
         io->use_scaling ?
            EmitRescaledRowsRGBA(dec, rows_data, in_stride, io->mb_h,
                                 rgba, buf->stride) :
#endif  // WEBP_REDUCE_SIZE
            EmitRows(output->colorspace, rows_data, in_stride,
                     io->mb_w, io->mb_h, rgba, buf->stride);
        // Update 'last_out_row'.
        dec->last_out_row += num_rows_out;
      } else {                              // convert to YUVA
        dec->last_out_row = io->use_scaling ?
            EmitRescaledRowsYUVA(dec, rows_data, in_stride, io->mb_h) :
            EmitRowsYUVA(dec, rows_data, in_stride, io->mb_w, io->mb_h);
      }
      assert(dec->last_out_row <= output->height);
    }
  }

  // Update 'last_row'.
  dec->last_row = row;
  assert(dec->last_row <= dec->height);
}